

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O3

string * __thiscall
V4L2Device::make_jpeg_file_name_abi_cxx11_(string *__return_storage_ptr__,V4L2Device *this)

{
  char **ppcVar1;
  bool bVar2;
  Options *pOVar3;
  pointer pcVar4;
  int iVar5;
  OptionDetails *pOVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  bool *pbVar8;
  tm *ptVar9;
  Writer *pWVar10;
  size_t sVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmpl;
  time_t t;
  tm lt;
  char name [4096];
  char *local_1108 [2];
  char local_10f8 [16];
  time_t local_10e8;
  Writer local_10e0;
  tm local_1070;
  char local_1038 [4104];
  
  pOVar3 = (this->options).super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ppcVar1 = &local_10e0.m_file;
  local_10e0._vptr_Writer = (_func_int **)ppcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10e0,"result","");
  pOVar6 = cxxopts::Options::operator[](pOVar3,(string *)&local_10e0);
  pbVar7 = cxxopts::OptionDetails::as<std::__cxx11::string>(pOVar6);
  pcVar4 = (pbVar7->_M_dataplus)._M_p;
  local_1108[0] = local_10f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1108,pcVar4,pcVar4 + pbVar7->_M_string_length);
  if (local_10e0._vptr_Writer != (_func_int **)ppcVar1) {
    operator_delete(local_10e0._vptr_Writer);
  }
  pOVar3 = (this->options).super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_10e0._vptr_Writer = (_func_int **)ppcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10e0,"strftime","");
  pOVar6 = cxxopts::Options::operator[](pOVar3,(string *)&local_10e0);
  pbVar8 = cxxopts::OptionDetails::as<bool>(pOVar6);
  bVar2 = *pbVar8;
  if (local_10e0._vptr_Writer != (_func_int **)ppcVar1) {
    operator_delete(local_10e0._vptr_Writer);
  }
  if (bVar2 == false) {
    iVar5 = snprintf(local_1038,0xfff,local_1108[0],(ulong)(uint)this->frames_taken);
  }
  else {
    local_10e8 = time((time_t *)0x0);
    ptVar9 = localtime_r(&local_10e8,&local_1070);
    if (ptVar9 == (tm *)0x0) {
      local_10e0._vptr_Writer = (_func_int **)&PTR__Writer_00162088;
      local_10e0.m_level = Error;
      local_10e0.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
      ;
      local_10e0.m_line = 0x1af;
      local_10e0.m_func = "std::string V4L2Device::make_jpeg_file_name()";
      local_10e0.m_verboseLevel = 0;
      local_10e0.m_logger = (Logger *)0x0;
      local_10e0.m_proceed = false;
      local_10e0.m_messageBuilder.m_logger = (Logger *)0x0;
      local_10e0.m_messageBuilder.m_containerLogSeperator = "";
      local_10e0.m_dispatchAction = NormalLog;
      local_10e0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_10e0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_10e0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pWVar10 = el::base::Writer::construct(&local_10e0,1,"default");
      if (pWVar10->m_proceed == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar10->m_messageBuilder).m_logger)->field_0x50,
                   "localtime_r() failed",0x14);
        if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((pWVar10->m_messageBuilder).m_logger)->field_0x50," ",1);
        }
      }
      el::base::Writer::~Writer(&local_10e0);
    }
    sVar11 = strftime(local_1038,0xfff,local_1108[0],&local_1070);
    iVar5 = (int)sVar11;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (iVar5 < 1) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    sVar11 = strlen(local_1038);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_1038,local_1038 + sVar11);
  }
  if (local_1108[0] != local_10f8) {
    operator_delete(local_1108[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
    make_jpeg_file_name()
    {
        char name[PATH_MAX];
        int rc = 0;

        auto tmpl = (*options)["result"].as<std::string>();

        auto use_strftime = (*options)["strftime"].as<bool>();
        if (use_strftime) {
            struct tm lt;
            auto t = std::time(nullptr);
            if (localtime_r(&t, &lt) == nullptr) {
                LOG(ERROR) << "localtime_r() failed";
            }
            rc = strftime(name, sizeof(name) - 1, tmpl.c_str(), &lt);
        } else {
            rc = snprintf(name, sizeof(name) - 1, tmpl.c_str(), frames_taken);
        }

        return (rc > 0 ? std::string(name) : std::string());
    }